

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_generic.cpp
# Opt level: O0

void __thiscall mpt::metatype::generic::generic(generic *this)

{
  generic *this_local;
  
  metatype(&this->super_metatype);
  (this->super_metatype).super_convertable._vptr_convertable = (_func_int **)&PTR_convert_0017b608;
  refcount::refcount(&this->_ref,1);
  this->_traits = (type_traits *)0x0;
  this->_val = (void *)0x0;
  this->_type = 0;
  return;
}

Assistant:

metatype::generic::~generic()
{
	if (_val && _traits && _traits->fini) {
		_traits->fini(_val);
	}
	_val = 0;
}